

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2RenderUtil.cpp
# Opt level: O0

void deqp::egl::gles2::readPixels(Functions *gl,Surface *dst,int x,int y,int width,int height)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  PixelBufferAccess local_50;
  int local_28;
  int local_24;
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  Surface *dst_local;
  Functions *gl_local;
  
  local_28 = height;
  local_24 = width;
  height_local = y;
  width_local = x;
  _y_local = dst;
  dst_local = (Surface *)gl;
  tcu::Surface::setSize(dst,width,height);
  iVar5 = width_local;
  iVar4 = height_local;
  iVar3 = local_24;
  iVar2 = local_28;
  pcVar1 = (code *)dst_local[0xc1].m_pixels.m_ptr;
  tcu::Surface::getAccess(&local_50,_y_local);
  pvVar6 = tcu::PixelBufferAccess::getDataPtr(&local_50);
  (*pcVar1)(iVar5,iVar4,iVar3,iVar2,0x1908,0x1401,pvVar6);
  return;
}

Assistant:

void readPixels (const glw::Functions& gl, tcu::Surface& dst, int x, int y, int width, int height)
{
	dst.setSize(width, height);
	gl.readPixels(x, y, width, height, GL_RGBA, GL_UNSIGNED_BYTE, dst.getAccess().getDataPtr());
}